

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

char * getUsage_abi_cxx11_(char *argv_0)

{
  char *in_RSI;
  allocator local_f9;
  string local_f8 [32];
  string local_d8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [40];
  char *argv_0_local;
  
  argv_0_local = argv_0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,in_RSI,&local_f9);
  std::operator+((char *)local_d8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"usage:   ");
  std::operator+(local_b8,(char *)local_d8);
  std::operator+(local_98,(char *)local_b8);
  std::operator+(local_78,(char *)local_98);
  std::operator+(local_58,(char *)local_78);
  std::operator+(local_38,(char *)local_58);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)argv_0,
                 (char *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_98);
  std::__cxx11::string::~string((string *)local_b8);
  std::__cxx11::string::~string(local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  return argv_0;
}

Assistant:

const std::string getUsage(const char* argv_0)
{
    return \
        "usage:   " + std::string(argv_0) + " [options]\n" +
        "options: -n <number of textures generate>\n"  +
        "         -i <index of the first texure>\n" +
        "         -d <output directory>\n" +
        "         -t <texture type>\n" +
        "         -r <image resolution>\n";
}